

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O3

int __thiscall filehandle::ptr::close(ptr *this,int __fd)

{
  int __v;
  int in_EAX;
  system_error *this_00;
  int *piVar1;
  error_category *__ecat;
  
  if (this->fh != -1) {
    in_EAX = ::close(this->fh);
    this->fh = -1;
    if (in_EAX == -1) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar1 = __errno_location();
      __v = *piVar1;
      __ecat = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(this_00,__v,__ecat,"close");
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return in_EAX;
}

Assistant:

void close()
        {
            if (fh==-1)
                return;
            if (-1 == ::close(fh)) {
                fh = -1;
                throw std::system_error(errno, std::generic_category(), "close");
            }
            fh = -1;
        }